

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O1

void serializeInOutVar(QDataStream *stream,InOutVariable *v,int version)

{
  BlockVariable *sv;
  BlockVariable *v_00;
  long lVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2.m_data = (storage_type *)(v->name).d.size;
  QVar2.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar2);
  operator<<(stream,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDataStream::operator<<(stream,v->type);
  serializeDecorations(stream,v,version);
  if (8 < version) {
    QDataStream::operator<<(stream,(int)(v->structMembers).d.size);
    lVar1 = (v->structMembers).d.size;
    if (lVar1 != 0) {
      v_00 = (v->structMembers).d.ptr;
      lVar1 = lVar1 * 0x68;
      do {
        serializeBlockMemberVar(stream,v_00);
        v_00 = v_00 + 1;
        lVar1 = lVar1 + -0x68;
      } while (lVar1 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void serializeInOutVar(QDataStream *stream, const QShaderDescription::InOutVariable &v,
                              int version)
{
    (*stream) << QString::fromUtf8(v.name);
    (*stream) << int(v.type);
    serializeDecorations(stream, v, version);
    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_INPUT_OUTPUT_INTERFACE_BLOCKS) {
        (*stream) << int(v.structMembers.size());
        for (const QShaderDescription::BlockVariable &sv : v.structMembers)
            serializeBlockMemberVar(stream, sv);
    }
}